

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

void __thiscall
density::
heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
::reentrant_consume_operation::commit_nodestroy(reentrant_consume_operation *this)

{
  if (this->m_control == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0x7a6);
  }
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::commit_consume_impl(this->m_queue,this->m_control);
  this->m_control = (ControlBlock *)0x0;
  return;
}

Assistant:

void commit_nodestroy() noexcept
            {
                DENSITY_ASSERT(!empty());

                bool destroy_type = !std::is_trivially_destructible<RUNTIME_TYPE>::value;
                if (destroy_type)
                {
                    auto const & type = complete_type();
                    type.RUNTIME_TYPE::~RUNTIME_TYPE();
                }

                m_queue->commit_consume_impl(m_control);
                m_control = nullptr;
            }